

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_is_a(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_BOOL *it_is)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  ulong uVar4;
  REF_INT RVar5;
  
  *it_is = 0;
  uVar4 = 0xffffffff;
  RVar5 = -1;
  if (-1 < node) {
    pRVar2 = ref_geom->ref_adj;
    uVar4 = 0xffffffff;
    RVar5 = -1;
    if (node < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)node];
      uVar4 = 0xffffffff;
      RVar5 = -1;
      if ((long)(int)uVar1 != -1) {
        RVar5 = pRVar2->item[(int)uVar1].ref;
        uVar4 = (ulong)uVar1;
      }
    }
  }
  while( true ) {
    if ((int)uVar4 == -1) {
      return 0;
    }
    if (ref_geom->descr[RVar5 * 6] == type) break;
    pRVar3 = ref_geom->ref_adj->item;
    uVar4 = (ulong)pRVar3[(int)uVar4].next;
    RVar5 = -1;
    if (uVar4 != 0xffffffffffffffff) {
      RVar5 = pRVar3[uVar4].ref;
    }
  }
  *it_is = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_is_a(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                 REF_BOOL *it_is) {
  REF_INT item, geom;
  *it_is = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      *it_is = REF_TRUE;
      return REF_SUCCESS;
    }
  }
  return REF_SUCCESS;
}